

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O0

void __thiscall
wasm::SuffixTree::RepeatedSubstringIterator::advance(RepeatedSubstringIterator *this)

{
  SuffixTreeInternalNode *this_00;
  bool bVar1;
  uint uVar2;
  reference ppSVar3;
  size_type sVar4;
  reference puVar5;
  uint local_bc;
  iterator iStack_b8;
  uint StartIdx;
  iterator __end2_1;
  iterator __begin2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  ret_type local_98;
  SuffixTreeLeafNode *Leaf;
  SuffixTreeInternalNode *InternalChild;
  pair<const_unsigned_int,_wasm::SuffixTreeNode_*> *ChildPair;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_int,_wasm::SuffixTreeNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>_>
  *__range2;
  uint Length;
  SuffixTreeInternalNode *Curr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> RepeatedSubstringStarts;
  RepeatedSubstringIterator *this_local;
  
  memset(&RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage,0,0x20);
  RepeatedSubstring::RepeatedSubstring
            ((RepeatedSubstring *)
             &RepeatedSubstringStarts.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  RepeatedSubstring::operator=
            (&this->RS,
             (RepeatedSubstring *)
             &RepeatedSubstringStarts.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  RepeatedSubstring::~RepeatedSubstring
            ((RepeatedSubstring *)
             &RepeatedSubstringStarts.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this->N = (SuffixTreeNode *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&Curr);
  do {
    bVar1 = std::
            vector<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
            ::empty(&this->InternalNodesToVisit);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_02530138;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&Curr);
    ppSVar3 = std::
              vector<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
              ::back(&this->InternalNodesToVisit);
    this_00 = *ppSVar3;
    std::vector<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>::
    pop_back(&this->InternalNodesToVisit);
    uVar2 = SuffixTreeNode::getConcatLen(&this_00->super_SuffixTreeNode);
    __end2 = std::
             unordered_map<unsigned_int,_wasm::SuffixTreeNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>_>
             ::begin(&this_00->Children);
    ChildPair = (pair<const_unsigned_int,_wasm::SuffixTreeNode_*> *)
                std::
                unordered_map<unsigned_int,_wasm::SuffixTreeNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>_>
                ::end(&this_00->Children);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_false>
                                *)&ChildPair), bVar1) {
      InternalChild =
           (SuffixTreeInternalNode *)
           std::__detail::
           _Node_iterator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_false,_false>::
           operator*(&__end2);
      Leaf = (SuffixTreeLeafNode *)
             llvm::dyn_cast<wasm::SuffixTreeInternalNode,wasm::SuffixTreeNode>
                       (*(SuffixTreeNode **)&(InternalChild->super_SuffixTreeNode).Kind);
      if ((ret_type)Leaf == (ret_type)0x0) {
        if (this->MinLength <= uVar2) {
          local_98 = llvm::cast<wasm::SuffixTreeLeafNode,wasm::SuffixTreeNode>
                               (*(SuffixTreeNode **)&(InternalChild->super_SuffixTreeNode).Kind);
          __range2_1._4_4_ = SuffixTreeLeafNode::getSuffixIdx(local_98);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&Curr,
                     (value_type_conflict2 *)((long)&__range2_1 + 4));
        }
      }
      else {
        std::vector<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
        ::push_back(&this->InternalNodesToVisit,(value_type *)&Leaf);
      }
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_false,_false>::
      operator++(&__end2);
    }
    bVar1 = SuffixTreeInternalNode::isRoot(this_00);
  } while ((bVar1) ||
          (sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&Curr),
          sVar4 < 2));
  this->N = &this_00->super_SuffixTreeNode;
  (this->RS).Length = uVar2;
  __end2_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&Curr);
  iStack_b8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&Curr);
  while (bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xffffffffffffff48), bVar1) {
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2_1);
    local_bc = *puVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&(this->RS).StartIndices,&local_bc);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2_1);
  }
LAB_02530138:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&Curr);
  return;
}

Assistant:

void SuffixTree::RepeatedSubstringIterator::advance() {
  // Clear the current state. If we're at the end of the range, then this
  // is the state we want to be in.
  RS = RepeatedSubstring();
  N = nullptr;

  // Each leaf node represents a repeat of a string.
  std::vector<unsigned> RepeatedSubstringStarts;

  // Continue visiting nodes until we find one which repeats more than once.
  while (!InternalNodesToVisit.empty()) {
    RepeatedSubstringStarts.clear();
    auto* Curr = InternalNodesToVisit.back();
    InternalNodesToVisit.pop_back();

    // Keep track of the length of the string associated with the node. If
    // it's too short, we'll quit.
    unsigned Length = Curr->getConcatLen();

    // Iterate over each child, saving internal nodes for visiting, and
    // leaf nodes in LeafChildren. Internal nodes represent individual
    // strings, which may repeat.
    for (auto& ChildPair : Curr->Children) {
      // Save all of this node's children for processing.
      if (auto* InternalChild =
            dyn_cast<SuffixTreeInternalNode>(ChildPair.second)) {
        InternalNodesToVisit.push_back(InternalChild);
        continue;
      }

      if (Length < MinLength) {
        continue;
      }

      // Have an occurrence of a potentially repeated string. Save it.
      auto* Leaf = cast<SuffixTreeLeafNode>(ChildPair.second);
      RepeatedSubstringStarts.push_back(Leaf->getSuffixIdx());
    }

    // The root never represents a repeated substring. If we're looking at
    // that, then skip it.
    if (Curr->isRoot()) {
      continue;
    }

    // Do we have any repeated substrings?
    if (RepeatedSubstringStarts.size() < 2) {
      continue;
    }

    // Yes. Update the state to reflect this, and then bail out.
    N = Curr;
    RS.Length = Length;
    for (unsigned StartIdx : RepeatedSubstringStarts) {
      RS.StartIndices.push_back(StartIdx);
    }
    break;
  }
  // At this point, either NewRS is an empty RepeatedSubstring, or it was
  // set in the above loop. Similarly, N is either nullptr, or the node
  // associated with NewRS.
}